

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_o2.cc
# Opt level: O0

MatrixXd * __thiscall
lf::geometry::QuadO2::Jacobian(MatrixXd *__return_storage_ptr__,QuadO2 *this,MatrixXd *local)

{
  Index *other;
  long lVar1;
  bool bVar2;
  runtime_error *this_00;
  Index IVar3;
  ArrayBase<Eigen::Transpose<Eigen::Block<Eigen::Reverse<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_0>,__1,_1,_true>_>_>
  *other_00;
  Index cols;
  bool local_939;
  NestedExpressionType local_938;
  Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1> local_930;
  ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_> local_918;
  ConstColwiseReturnType local_900;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1>_>
  local_8e8;
  MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1>_>_>
  local_8b0;
  Replicate<Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,__1> local_878;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_860;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_838;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_7f8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1>_>_>_>
  local_7a0;
  VectorwiseOp<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> local_700;
  Nested local_6f8;
  undefined1 local_6f0 [8];
  MatrixXd local_reversed;
  ConstColXpr local_6a0;
  ConstTransposeReturnType local_668;
  ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
  local_630;
  NestedExpressionType local_5f8;
  ExpressionTypeNested local_5f0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>,__1,_1>_>
  local_5e8;
  Type local_590;
  CoeffReturnType local_558;
  Type local_550;
  ColXpr local_518;
  TransposeReturnType local_4e8;
  VectorwiseOp<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,_1> local_4b8;
  Nested local_4b0;
  NestedExpressionType local_4a8;
  ExpressionTypeNested local_4a0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Reverse<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,_1>_>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Block<Eigen::Reverse<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_0>,__1,_1,_true>_>,__1,_1>_>
  local_498;
  long local_448;
  long i;
  Index local_438;
  undefined1 local_430 [8];
  MatrixXd tmp_gamma;
  undefined1 local_400 [8];
  MatrixXd tmp_epsilon_x_2;
  Index local_3e0;
  undefined1 local_3d8 [8];
  MatrixXd tmp_epsilon;
  ConstRowXpr local_388;
  undefined1 local_350 [8];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  local_colwise_product;
  DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  local_2d0 [16];
  ConstColwiseReturnType local_2c0;
  undefined1 local_2b0 [8];
  ConstReverseReturnType local_squared_reversed;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  stringstream local_220 [8];
  stringstream ss;
  ostream local_210 [376];
  Scalar local_98;
  NestedExpressionType local_90;
  CmpLEReturnType local_88;
  NestedExpressionType local_60;
  Scalar local_58;
  RCmpLEReturnType local_50;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_20;
  MatrixXd *local_local;
  QuadO2 *this_local;
  
  local_58 = 0.0;
  local_20 = (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local;
  local_local = (MatrixXd *)this;
  this_local = (QuadO2 *)__return_storage_ptr__;
  local_60 = (NestedExpressionType)
             Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::array
                       ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local);
  Eigen::operator<=(&local_50,&local_58,
                    (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     *)&local_60);
  bVar2 = Eigen::
          DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
          ::all((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                 *)&local_50);
  local_939 = false;
  if (bVar2) {
    local_90 = (NestedExpressionType)
               Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::array(local_20);
    local_98 = 1.0;
    Eigen::ArrayBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::
    operator<=(&local_88,
               (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
               &local_90,&local_98);
    local_939 = Eigen::
                DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>_>_>
                ::all((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>_>
                       *)&local_88);
  }
  if (((local_939 ^ 0xffU) & 1) != 0) {
    std::__cxx11::stringstream::stringstream(local_220);
    std::operator<<(local_210,"local coordinates out of bounds for reference element");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"(0. <= local.array()).all() && (local.array() <= 1.).all()",
               &local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o2.cc"
               ,&local_279);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed
              (&local_250,&local_278,0x47,(string *)&local_squared_reversed.m_matrix.field_0x8);
    std::__cxx11::string::~string((string *)&local_squared_reversed.m_matrix.field_0x8);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"this code should not be reached");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_colwise_product._112_8_ =
       Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::array(local_20);
  Eigen::ArrayBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::square
            ((SquareReturnType *)local_2d0,
             (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_colwise_product.field_0x70);
  Eigen::
  DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
  ::colwise(&local_2c0,local_2d0);
  Eigen::
  VectorwiseOp<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_0>
  ::reverse((ConstReverseReturnType *)local_2b0,&local_2c0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
            (&local_388,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20,0);
  other = &tmp_epsilon.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
            ((ConstRowXpr *)other,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20,1
            );
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>>::
  cwiseProduct<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)local_350,&local_388,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)other);
  local_3e0 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::rows
                        (&(this->gamma_).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>);
  IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20);
  tmp_epsilon_x_2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = IVar3 * 2;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<long,long>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_3d8,&local_3e0,
             &tmp_epsilon_x_2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols);
  IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::replicate
            ((Replicate<Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,__1> *)
             &tmp_gamma.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols,(DenseBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)&this->epsilon_x_2_,1,
             IVar3);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Replicate<Eigen::Matrix<double,_1,2,0,_1,2>,_1,_1>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_400,
             (EigenBase<Eigen::Replicate<Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,__1>_> *)
             &tmp_gamma.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols);
  local_438 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::rows
                        (&(this->gamma_).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>);
  IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20);
  i = IVar3 * 2;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<long,long>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_430,&local_438,&i);
  for (local_448 = 0; lVar1 = local_448,
      IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                        ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20),
      lVar1 < IVar3; local_448 = local_448 + 1) {
    local_4b8.m_matrix =
         (ExpressionTypeNested)
         Eigen::DenseBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::rowwise
                   ((DenseBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)&this->epsilon_);
    local_4b0 = (Nested)Eigen::VectorwiseOp<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_1>::
                        reverse(&local_4b8);
    local_4a8.m_matrix =
         (Nested)Eigen::MatrixBase<Eigen::Reverse<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_1>_>
                 ::array((MatrixBase<Eigen::Reverse<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,_1>_>
                          *)&local_4b0);
    local_4a0.m_expression.m_matrix =
         (NestedExpressionType)
         Eigen::
         DenseBase<Eigen::ArrayWrapper<const_Eigen::Reverse<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_1>_>_>
         ::rowwise((DenseBase<Eigen::ArrayWrapper<const_Eigen::Reverse<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,_1>_>_>
                    *)&local_4a8);
    Eigen::
    DenseBase<Eigen::Reverse<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_0>_>
    ::col(&local_518,
          (DenseBase<Eigen::Reverse<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_0>_>
           *)local_2b0,local_448);
    Eigen::
    DenseBase<Eigen::Block<Eigen::Reverse<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_0>,_-1,_1,_true>_>
    ::transpose(&local_4e8,
                (DenseBase<Eigen::Block<Eigen::Reverse<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_0>,__1,_1,_true>_>
                 *)&local_518);
    other_00 = Eigen::
               ArrayBase<Eigen::Transpose<Eigen::Block<Eigen::Reverse<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_0>,_-1,_1,_true>_>_>
               ::array((ArrayBase<Eigen::Transpose<Eigen::Block<Eigen::Reverse<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_0>,__1,_1,_true>_>_>
                        *)&local_4e8);
    Eigen::
    VectorwiseOp<Eigen::ArrayWrapper<Eigen::Reverse<Eigen::Matrix<double,-1,2,0,-1,2>const,1>const>const,1>
    ::operator*(&local_498,
                (VectorwiseOp<Eigen::ArrayWrapper<Eigen::Reverse<Eigen::Matrix<double,_1,2,0,_1,2>const,1>const>const,1>
                 *)&local_4a0,
                (DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Reverse<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_0>,__1,_1,_true>_>_>
                 *)other_00);
    lVar1 = local_448 * 2;
    IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_3d8);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<long,int>
              (&local_550,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_3d8,0,lVar1,IVar3,
               2);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)&local_550,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Reverse<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,_1>_>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Block<Eigen::Reverse<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_0>,__1,_1,_true>_>,__1,_1>_>_>
                *)&local_498);
    local_558 = Eigen::
                DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_0>
                ::operator()((DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_0>
                              *)local_350,local_448);
    lVar1 = local_448 * 2;
    IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_400);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<long,int>
              (&local_590,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_400,0,lVar1,IVar3,
               2);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
    operator*=((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
               &local_590,&local_558);
    local_5f8 = (NestedExpressionType)
                Eigen::MatrixBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::array
                          ((MatrixBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)&this->gamma_x_2_)
    ;
    local_5f0.m_expression =
         (NestedExpressionType)
         Eigen::DenseBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>_>::
         rowwise((DenseBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>_>_> *)
                 &local_5f8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_6a0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20,local_448
              );
    Eigen::DenseBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
    transpose(&local_668,
              (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
               *)&local_6a0);
    Eigen::
    MatrixBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>_>
    ::array(&local_630,
            (MatrixBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
             *)&local_668);
    Eigen::VectorwiseOp<Eigen::ArrayWrapper<Eigen::Matrix<double,-1,2,0,-1,2>const>const,1>::
    operator*(&local_5e8,
              (VectorwiseOp<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,2,0,_1,2>const>const,1> *)
              &local_5f0,
              (DenseBase<Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
               *)&local_630);
    lVar1 = local_448 * 2;
    IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_430);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<long,int>
              ((Type *)&local_reversed.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_cols,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_430,0,lVar1,
               IVar3,2);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)
               &local_reversed.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>,__1,_1>_>_>
                *)&local_5e8);
  }
  local_700.m_matrix =
       (ExpressionTypeNested)
       Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::colwise
                 ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20);
  local_6f8 = (Nested)Eigen::VectorwiseOp<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                      reverse(&local_700);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Reverse<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_6f0,
             (EigenBase<Eigen::Reverse<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_> *)
             &local_6f8);
  cols = Eigen::EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::size
                   ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_6f0,1,cols);
  IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::replicate
            (&local_878,(DenseBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)&this->beta_,1,IVar3);
  Eigen::MatrixBase<Eigen::Replicate<Eigen::Matrix<double,-1,2,0,-1,2>,-1,-1>>::operator+
            (&local_860,
             (MatrixBase<Eigen::Replicate<Eigen::Matrix<double,_1,2,0,_1,2>,_1,_1>> *)&local_878,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_430);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Replicate<Eigen::Matrix<double,-1,2,0,-1,2>,-1,-1>const,Eigen::Matrix<double,-1,-1,0,-1,-1>const>>
  ::operator+(&local_838,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Replicate<Eigen::Matrix<double,_1,2,0,_1,2>,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
               *)&local_860,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_3d8);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Replicate<Eigen::Matrix<double,-1,2,0,-1,2>,-1,-1>const,Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,Eigen::Matrix<double,-1,-1,0,-1,-1>const>>
  ::operator+(&local_7f8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Replicate<Eigen::Matrix<double,_1,2,0,_1,2>,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
               *)&local_838,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_400);
  IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
                    (&(this->delta_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
  ;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::replicate
            (&local_930,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_6f0,IVar3,1);
  Eigen::MatrixBase<Eigen::Replicate<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1>_>::array
            (&local_918,
             (MatrixBase<Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_> *)
             &local_930);
  Eigen::
  DenseBase<Eigen::ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1>_>_>
  ::colwise(&local_900,
            (DenseBase<Eigen::ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_>_>
             *)&local_918);
  local_938 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::array
                        ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->delta_);
  Eigen::
  VectorwiseOp<Eigen::ArrayWrapper<Eigen::Replicate<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1>const>const,0>
  ::operator*(&local_8e8,
              (VectorwiseOp<Eigen::ArrayWrapper<Eigen::Replicate<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1>const>const,0>
               *)&local_900,
              (DenseBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
              &local_938);
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_1,_-1>_>_>
  ::matrix(&local_8b0,
           (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1>_>_>
            *)&local_8e8);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Replicate<Eigen::Matrix<double,-1,2,0,-1,2>,-1,-1>const,Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,Eigen::Matrix<double,-1,-1,0,-1,-1>const>>
  ::operator+(&local_7a0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Replicate<Eigen::Matrix<double,_1,2,0,_1,2>,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
               *)&local_7f8,
              (MatrixBase<Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1>_>_>_>
               *)&local_8b0);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Replicate<Eigen::Matrix<double,_1,2,0,_1,2>,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Replicate<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1>const>const,Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>const>,1,_1>const>>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1>_>_>_>_>
              *)&local_7a0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_6f0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_430);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_400);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_3d8);
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd QuadO2::Jacobian(const Eigen::MatrixXd& local) const {
  LF_VERIFY_MSG((0. <= local.array()).all() && (local.array() <= 1.).all(),
                "local coordinates out of bounds for reference element");

  auto local_squared_reversed = local.array().square().colwise().reverse();
  auto local_colwise_product = local.row(0).cwiseProduct(local.row(1));

  Eigen::MatrixXd tmp_epsilon(gamma_.rows(), 2 * local.cols());
  Eigen::MatrixXd tmp_epsilon_x_2 = epsilon_x_2_.replicate(1, local.cols());
  Eigen::MatrixXd tmp_gamma(gamma_.rows(), 2 * local.cols());

  for (long i = 0; i < local.cols(); ++i) {
    tmp_epsilon.block(0, 2 * i, tmp_epsilon.rows(), 2) =
        epsilon_.rowwise().reverse().array().rowwise() *
        local_squared_reversed.col(i).transpose().array();
    tmp_epsilon_x_2.block(0, 2 * i, tmp_epsilon_x_2.rows(), 2) *=
        local_colwise_product(i);
    tmp_gamma.block(0, 2 * i, tmp_gamma.rows(), 2) =
        gamma_x_2_.array().rowwise() * local.col(i).transpose().array();
  }

  Eigen::MatrixXd local_reversed = local.colwise().reverse();
  local_reversed.resize(1, local.size());

  return beta_.replicate(1, local.cols()) + tmp_gamma + tmp_epsilon +
         tmp_epsilon_x_2 +
         (local_reversed.replicate(delta_.rows(), 1).array().colwise() *
          delta_.array())
             .matrix();
}